

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::delete_slider(Plotter *this,size_t idx)

{
  bool bVar1;
  reference puVar2;
  iterator __position;
  ulong in_RSI;
  __normal_iterator<nivalis::SliderData_*,_std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>_>
  *in_RDI;
  size_t *i;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  key_type *__x;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  __normal_iterator<const_nivalis::SliderData_*,_std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>_>
  *this_00;
  vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffd8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffe0;
  
  end_slider_animation((Plotter *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)&stack0xffffffffffffffe0);
    if (in_RSI < *puVar2) {
      *puVar2 = *puVar2 - 1;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  __x = (key_type *)(in_RDI + 0x12);
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::operator[]
            ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)(in_RDI + 0xf),
             in_RSI);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(in_stack_ffffffffffffffa0,__x);
  this_00 = (__normal_iterator<const_nivalis::SliderData_*,_std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>_>
             *)(in_RDI + 0xf);
  __position = std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::begin
                         ((vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_> *)__x);
  __gnu_cxx::
  __normal_iterator<nivalis::SliderData_*,_std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>_>
  ::operator+(in_RDI,(difference_type)this_00);
  __gnu_cxx::
  __normal_iterator<nivalis::SliderData_const*,std::vector<nivalis::SliderData,std::allocator<nivalis::SliderData>>>
  ::__normal_iterator<nivalis::SliderData*>
            (this_00,(__normal_iterator<nivalis::SliderData_*,_std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>_>
                      *)__x);
  std::vector<nivalis::SliderData,_std::allocator<nivalis::SliderData>_>::erase
            (in_stack_ffffffffffffffb0,(const_iterator)__position._M_current);
  std::__cxx11::string::clear();
  return;
}

Assistant:

void Plotter::delete_slider(size_t idx) {
    // Remove from slider animation list and correct indices
    end_slider_animation(idx);
    for (size_t& i : animating_sliders) {
        if (i > idx) i--;
    }
    // Erase the slider
    sliders_vars.erase(sliders[idx].var_name);
    sliders.erase(sliders.begin() + idx);
    slider_error.clear();
}